

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict declaration_specs(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  ushort uVar1;
  short sVar2;
  parse_ctx *ppVar3;
  token_t ptVar4;
  undefined8 uVar5;
  c2m_ctx_t c2m_ctx_00;
  short *psVar6;
  pos_t pVar7;
  pos_t p;
  node_t_conflict n;
  size_t sVar8;
  node_t_conflict pnVar9;
  node_t_conflict pnVar10;
  char *pcVar11;
  node_t_conflict extraout_RDX;
  node_t_conflict extraout_RDX_00;
  node_t_conflict arg_00;
  node_code_t nVar12;
  int iVar13;
  undefined8 uVar14;
  char *format;
  parse_ctx_t parse_ctx_1;
  bool bVar15;
  pos_t pVar16;
  node_t_conflict local_78;
  
  ppVar3 = c2m_ctx->parse_ctx;
  ptVar4 = ppVar3->curr_token;
  pcVar11 = (ptVar4->pos).fname;
  uVar5._0_4_ = (ptVar4->pos).lno;
  uVar5._4_4_ = (ptVar4->pos).ln_pos;
  p = ptVar4->pos;
  n = new_node(c2m_ctx,N_LIST);
  bVar15 = arg != (node_t_conflict)0x0;
  local_78 = (node_t_conflict)0x0;
  do {
    while( true ) {
      c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->parse_ctx;
      ptVar4 = ppVar3->curr_token;
      pnVar10 = local_78;
      if (*(short *)ptVar4 != 0x113) break;
      psVar6 = (short *)c2m_ctx_00->env[0].__jmpbuf[0];
      if (*psVar6 != 0x113) {
        if (*(int *)&c2m_ctx_00->ctx != 0) goto LAB_00194dec;
        iVar13 = 0x113;
LAB_00194ddc:
        pcVar11 = get_token_name(c2m_ctx,iVar13);
        syntax_error(c2m_ctx,pcVar11);
        goto LAB_00194dec;
      }
      pVar7 = *(pos_t *)(psVar6 + 4);
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x28) {
        if (*(int *)&c2m_ctx_00->ctx != 0) goto LAB_00194dec;
        iVar13 = 0x28;
        goto LAB_00194ddc;
      }
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      sVar8 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
      pnVar9 = type_name(c2m_ctx,1);
      record_stop(c2m_ctx,sVar8,(uint)(pnVar9 == &err_struct));
      if ((pnVar9 == &err_struct) && (pnVar9 = cond_expr(c2m_ctx,no_err_p), pnVar9 == &err_struct))
      goto LAB_00194dec;
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x29) {
        if (*(int *)&c2m_ctx_00->ctx != 0) goto LAB_00194dec;
        iVar13 = 0x29;
        goto LAB_00194ddc;
      }
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar9 = new_pos_node1(c2m_ctx,N_ALIGNAS,pVar7,pnVar9);
      if (pnVar9 == &err_struct) goto LAB_00194dec;
LAB_00194d19:
      local_78 = pnVar10;
      op_append(c2m_ctx,n,pnVar9);
      bVar15 = true;
    }
    pVar7 = ptVar4->pos;
    sVar8 = record_start(c2m_ctx_00);
    ptVar4 = c2m_ctx->parse_ctx->curr_token;
    uVar1 = *(ushort *)ptVar4;
    if (uVar1 < 0x12d) {
      if (uVar1 == 0x118) {
        format = (ptVar4->pos).fname;
        uVar14._0_4_ = (ptVar4->pos).lno;
        uVar14._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        if (c2m_ctx->options->pedantic_p == 0) {
          warning(c2m_ctx,0x1c1dbb,format,uVar14);
        }
        else {
          error(c2m_ctx,0x1c1d9b,format,uVar14);
        }
        nVar12 = N_THREAD_LOCAL;
        goto LAB_00194a99;
      }
      if (uVar1 == 0x11a) {
        format = (ptVar4->pos).fname;
        uVar14._0_4_ = (ptVar4->pos).lno;
        uVar14._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nVar12 = N_AUTO;
        goto LAB_00194a99;
      }
      if (uVar1 == 0x125) {
        format = (ptVar4->pos).fname;
        uVar14._0_4_ = (ptVar4->pos).lno;
        uVar14._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nVar12 = N_EXTERN;
        goto LAB_00194a99;
      }
LAB_00194a15:
      if (c2m_ctx->parse_ctx->record_level == 0) {
        syntax_error(c2m_ctx,"a storage specifier");
      }
      record_stop(c2m_ctx,sVar8,1);
      iVar13 = (int)sVar8;
    }
    else {
      if (uVar1 == 0x12d) {
        format = (ptVar4->pos).fname;
        uVar14._0_4_ = (ptVar4->pos).lno;
        uVar14._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nVar12 = N_REGISTER;
      }
      else if (uVar1 == 0x133) {
        format = (ptVar4->pos).fname;
        uVar14._0_4_ = (ptVar4->pos).lno;
        uVar14._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nVar12 = N_STATIC;
      }
      else {
        if (uVar1 != 0x136) goto LAB_00194a15;
        format = (ptVar4->pos).fname;
        uVar14._0_4_ = (ptVar4->pos).lno;
        uVar14._4_4_ = (ptVar4->pos).ln_pos;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        nVar12 = N_TYPEDEF;
      }
LAB_00194a99:
      pnVar9 = new_node(c2m_ctx,nVar12);
      pVar16.lno = (int)uVar14;
      pVar16.ln_pos = (int)((ulong)uVar14 >> 0x20);
      pVar16.fname = format;
      add_pos(c2m_ctx,pnVar9,pVar16);
      record_stop(c2m_ctx,sVar8,(uint)(pnVar9 == &err_struct));
      iVar13 = (int)sVar8;
      if (pnVar9 != &err_struct) goto LAB_00194d19;
    }
    sVar8 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
    pnVar9 = type_qual(c2m_ctx,iVar13);
    record_stop(c2m_ctx,sVar8,(uint)(pnVar9 == &err_struct));
    if (pnVar9 != &err_struct) goto LAB_00194d19;
    sVar8 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
    ptVar4 = c2m_ctx->parse_ctx->curr_token;
    sVar2 = *(short *)ptVar4;
    if (sVar2 == 0x12a) {
      nVar12 = N_INLINE;
LAB_00194b3f:
      pVar16 = ptVar4->pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar9 = new_node(c2m_ctx,nVar12);
      add_pos(c2m_ctx,pnVar9,pVar16);
      record_stop(c2m_ctx,sVar8,(uint)(pnVar9 == &err_struct));
      arg_00 = extraout_RDX;
      if (pnVar9 != &err_struct) goto LAB_00194d19;
    }
    else {
      if (sVar2 == 0x116) {
        nVar12 = N_NO_RETURN;
        goto LAB_00194b3f;
      }
      if (c2m_ctx->parse_ctx->record_level == 0) {
        syntax_error(c2m_ctx,"a function specifier");
      }
      record_stop(c2m_ctx,sVar8,1);
      arg_00 = extraout_RDX_00;
    }
    if (!bVar15) {
      pnVar9 = type_spec(c2m_ctx,no_err_p,local_78);
      pnVar10 = pnVar9;
      if (pnVar9 == &err_struct) {
LAB_00194dec:
        return &err_struct;
      }
      goto LAB_00194d19;
    }
    pnVar9 = try_arg_f(c2m_ctx,(nonterm_arg_func_t)local_78,arg_00);
    pnVar10 = pnVar9;
    if (pnVar9 != &err_struct) goto LAB_00194d19;
    pnVar10 = try_attr_spec(c2m_ctx,pVar7,(node_t_conflict *)0x0);
    if ((pnVar10 == &err_struct) || (bVar15 = true, pnVar10 == (node_t_conflict)0x0)) {
      if (local_78 == (node_t_conflict)0x0 && arg != (node_t_conflict)0x0) {
        if (c2m_ctx->options->pedantic_p != 0) {
          warning(c2m_ctx,0x1bfec8,pcVar11,uVar5);
        }
        pnVar10 = new_node(c2m_ctx,N_INT);
        add_pos(c2m_ctx,pnVar10,p);
        op_append(c2m_ctx,n,pnVar10);
      }
      return n;
    }
  } while( true );
}

Assistant:

DA (declaration_specs) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, r, prev_type_spec = NULL;
  int first_p;
  pos_t pos = curr_token->pos, spec_pos;

  list = new_node (c2m_ctx, N_LIST);
  for (first_p = arg == NULL;; first_p = FALSE) {
    spec_pos = curr_token->pos;
    if (C (T_ALIGNAS)) {
      P (align_spec);
    } else if ((r = TRY (sc_spec)) != err_node) {
    } else if ((r = TRY (type_qual)) != err_node) {
    } else if ((r = TRY (func_spec)) != err_node) {
    } else if (first_p) {
      PA (type_spec, prev_type_spec);
      prev_type_spec = r;
    } else if ((r = TRY_A (type_spec, prev_type_spec)) != err_node) {
      prev_type_spec = r;
    } else if ((r = try_attr_spec (c2m_ctx, spec_pos, FALSE)) != err_node && r != NULL) {
      continue; /* ignore attrs for declaration specs (type attrs) */
    } else
      break;
    op_append (c2m_ctx, list, r);
  }
  if (prev_type_spec == NULL && arg != NULL) {
    if (c2m_options->pedantic_p) warning (c2m_ctx, pos, "type defaults to int");
    r = new_pos_node (c2m_ctx, N_INT, pos);
    op_append (c2m_ctx, list, r);
  }
  return list;
}